

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::abortMessage(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint source;
  string message;
  string local_40;
  
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  source = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  assignStringFromCaddress(this,&local_40,source,(ulong)uVar1);
  throwMessage(this,&local_40,errorAbortQuote);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void abortMessage() {
			auto count = dStack.getTop(); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			std::string message{};
			assignStringFromCaddress(message,caddr, count);
			// same action as abort()
			throwMessage(message,errorAbortQuote);
		}